

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O2

Vector2 MeasureTextEx(Font font,char *text,float fontSize,float spacing)

{
  Vector2 VVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  CharInfo *pCVar5;
  int i;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  float fVar11;
  float local_80;
  float local_7c;
  int next;
  float local_74;
  float local_70;
  float local_6c;
  Rectangle *local_68;
  char *local_60;
  float local_58;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  local_70 = spacing;
  local_60 = text;
  local_58 = fontSize;
  uVar3 = TextLength(text);
  local_7c = (float)font.baseSize;
  uVar10 = 0;
  uVar8 = (ulong)(uint)font.charsCount;
  if (font.charsCount < 1) {
    uVar8 = uVar10;
  }
  fVar11 = 0.0;
  uStack_44 = 0;
  uStack_40 = 0;
  uStack_3c = 0;
  local_68 = font.recs;
  local_6c = local_7c * 1.5;
  uVar7 = 0;
  local_80 = 0.0;
  iVar9 = 0;
  local_74 = local_7c;
  do {
    if ((int)uVar3 <= iVar9) {
      if (fVar11 <= local_80) {
        fVar11 = local_80;
      }
      VVar1.y = (local_58 / local_74) * local_7c;
      VVar1.x = fVar11 * (local_58 / local_74) + (float)((int)uVar10 + -1) * local_70;
      return VVar1;
    }
    next = 0;
    uVar7 = uVar7 + 1;
    local_48 = fVar11;
    iVar4 = GetNextCodepoint(local_60 + iVar9,&next);
    pCVar5 = font.chars;
    for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
      if (pCVar5->value == iVar4) goto LAB_0012a77d;
      pCVar5 = pCVar5 + 1;
    }
    uVar6 = 0x3f;
LAB_0012a77d:
    iVar2 = 1;
    if ((iVar4 == 0x3f) || (iVar2 = next, iVar4 != 10)) {
      next = iVar2;
      if (font.chars[uVar6].advanceX == 0) {
        fVar11 = (float)font.chars[uVar6].offsetX + local_68[uVar6].width;
      }
      else {
        fVar11 = (float)font.chars[uVar6].advanceX;
      }
      fVar11 = local_48 + fVar11;
    }
    else {
      if (local_48 <= local_80) {
        local_48 = local_80;
      }
      local_7c = local_7c + local_6c;
      fVar11 = 0.0;
      uStack_44 = 0;
      uStack_40 = 0;
      uStack_3c = 0;
      uVar7 = 0;
      local_80 = local_48;
    }
    if ((int)uVar10 <= (int)uVar7) {
      uVar10 = (ulong)uVar7;
    }
    iVar9 = iVar9 + next;
  } while( true );
}

Assistant:

Vector2 MeasureTextEx(Font font, const char *text, float fontSize, float spacing)
{
    int len = TextLength(text);
    int tempLen = 0;                // Used to count longer text line num chars
    int lenCounter = 0;

    float textWidth = 0.0f;
    float tempTextWidth = 0.0f;     // Used to count longer text line width

    float textHeight = (float)font.baseSize;
    float scaleFactor = fontSize/(float)font.baseSize;

    int letter = 0;                 // Current character
    int index = 0;                  // Index position in sprite font

    for (int i = 0; i < len; i++)
    {
        lenCounter++;

        int next = 0;
        letter = GetNextCodepoint(&text[i], &next);
        index = GetGlyphIndex(font, letter);

        // NOTE: normally we exit the decoding sequence as soon as a bad byte is found (and return 0x3f)
        // but we need to draw all of the bad bytes using the '?' symbol so to not skip any we set next = 1
        if (letter == 0x3f) next = 1;
        i += next - 1;

        if (letter != '\n')
        {
            if (font.chars[index].advanceX != 0) textWidth += font.chars[index].advanceX;
            else textWidth += (font.recs[index].width + font.chars[index].offsetX);
        }
        else
        {
            if (tempTextWidth < textWidth) tempTextWidth = textWidth;
            lenCounter = 0;
            textWidth = 0;
            textHeight += ((float)font.baseSize*1.5f); // NOTE: Fixed line spacing of 1.5 lines
        }

        if (tempLen < lenCounter) tempLen = lenCounter;
    }

    if (tempTextWidth < textWidth) tempTextWidth = textWidth;

    Vector2 vec = { 0 };
    vec.x = tempTextWidth*scaleFactor + (float)((tempLen - 1)*spacing); // Adds chars spacing to measure
    vec.y = textHeight*scaleFactor;

    return vec;
}